

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<unsigned_int>
          (BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,InstrByteCodeRegisterUses *value)

{
  Type piVar1;
  BVSparse<Memory::JitArenaAllocator> *pBVar2;
  KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses> *pKVar3;
  undefined6 uVar4;
  uint uVar5;
  Type pSVar6;
  uint uVar7;
  
  piVar1 = this->buckets;
  uVar5 = 0;
  if (piVar1 != (Type)0x0) {
    uVar5 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar7 = piVar1[uVar5];
    uVar5 = 0;
    if (-1 < (int)uVar7) {
      pSVar6 = this->entries;
      uVar5 = 0;
      do {
        if (pSVar6[uVar7].
            super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
            super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.key ==
            *key) {
          if (this->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(this->stats,uVar5);
            pSVar6 = this->entries;
          }
          pKVar3 = &pSVar6[uVar7].
                    super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>;
          uVar4 = *(undefined6 *)
                   &(pKVar3->
                    super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
                    ).super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.
                    value.field_0x2;
          pBVar2 = pSVar6[uVar7].
                   super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
                   super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
                   .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.
                   value.bv;
          value->capturingOpCode =
               (pKVar3->
               super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
               ).super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value
               .capturingOpCode;
          *(undefined6 *)&value->field_0x2 = uVar4;
          value->bv = pBVar2;
          return true;
        }
        uVar5 = uVar5 + 1;
        uVar7 = pSVar6[uVar7].
                super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
                super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.next;
      } while (-1 < (int)uVar7);
    }
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,uVar5);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }